

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderModifier.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::BlenderModifier_Mirror::DoIt
          (BlenderModifier_Mirror *this,aiNode *out,ConversionData *conv_data,
          ElemBase *orig_modifier,Scene *param_4,Object *orig_object)

{
  float _x;
  float _y;
  pointer ppaVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  mywrap *pmVar4;
  mywrap *this_00;
  size_type sVar5;
  aiMesh **ppaVar6;
  element_type *peVar7;
  ulong uVar8;
  Logger *this_01;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_02;
  basic_formatter *this_03;
  uint local_2d4;
  uint local_2cc;
  float local_2bc;
  float local_2b4;
  float local_2ac;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_118;
  ConversionData *local_f8;
  pointer local_f0;
  uint *nind;
  aiFace *paStack_e0;
  uint fi;
  aiFace *face;
  aiVector3D *paStack_d0;
  uint i_7;
  aiVector3D *v_5;
  uint i_6;
  uint n;
  float vs;
  float us;
  aiVector3D *v_4;
  aiVector3D *paStack_a8;
  uint i_5;
  aiVector3D *v_3;
  aiVector3D *paStack_98;
  uint i_4;
  aiVector3D *v_2;
  aiVector3D *paStack_88;
  uint i_3;
  aiVector3D *v_1;
  aiVector3D *paStack_78;
  uint i_2;
  aiVector3D *v;
  undefined1 local_68 [4];
  uint i_1;
  aiVector3D center;
  float zs;
  float ys;
  float xs;
  aiMesh *mesh;
  ElemBase *pEStack_40;
  uint i;
  MirrorModifierData *mir;
  Object *orig_object_local;
  Scene *param_4_local;
  ElemBase *orig_modifier_local;
  ConversionData *conv_data_local;
  aiNode *out_local;
  BlenderModifier_Mirror *this_local;
  
  pEStack_40 = orig_modifier;
  mir = (MirrorModifierData *)orig_object;
  orig_object_local = (Object *)param_4;
  param_4_local = (Scene *)orig_modifier;
  orig_modifier_local = (ElemBase *)conv_data;
  conv_data_local = (ConversionData *)out;
  out_local = (aiNode *)this;
  if (*(int *)&orig_modifier[4]._vptr_ElemBase != 5) {
    __assert_fail("mir.modifier.type == ModifierData::eModifierType_Mirror",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderModifier.cpp"
                  ,0xa4,
                  "virtual void Assimp::Blender::BlenderModifier_Mirror::DoIt(aiNode &, ConversionData &, const ElemBase &, const Scene &, const Object &)"
                 );
  }
  pmVar4 = TempArray<std::vector,_aiMesh>::operator->(&conv_data->meshes);
  this_00 = TempArray<std::vector,_aiMesh>::operator->
                      ((TempArray<std::vector,_aiMesh> *)(orig_modifier_local + 3));
  sVar5 = ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(this_00);
  ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
            (pmVar4,sVar5 + *(uint *)&conv_data_local[3].lights.arr.
                                      super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (mesh._4_4_ = 0;
      mesh._4_4_ <
      *(uint *)&conv_data_local[3].lights.arr.
                super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage; mesh._4_4_ = mesh._4_4_ + 1) {
    ppaVar6 = TempArray<std::vector,_aiMesh>::operator[]
                        ((TempArray<std::vector,_aiMesh> *)(orig_modifier_local + 3),
                         (ulong)*(uint *)((long)conv_data_local[3].materials.arr.
                                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         (ulong)mesh._4_4_ * 4));
    SceneCombiner::Copy((aiMesh **)&ys,*ppaVar6);
    local_2ac = -1.0;
    if (((ulong)pEStack_40[6].dna_type & 0x80000) == 0) {
      local_2ac = 1.0;
    }
    local_2b4 = -1.0;
    if (((ulong)pEStack_40[6].dna_type & 0x100000) == 0) {
      local_2b4 = 1.0;
    }
    center.z = local_2b4;
    local_2bc = -1.0;
    if (((ulong)pEStack_40[6].dna_type & 0x200000) == 0) {
      local_2bc = 1.0;
    }
    center.y = local_2bc;
    bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(pEStack_40 + 7));
    if (bVar3) {
      peVar7 = ::std::
               __shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(pEStack_40 + 7));
      _x = peVar7->obmat[3][0];
      peVar7 = ::std::
               __shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(pEStack_40 + 7));
      _y = peVar7->obmat[3][1];
      peVar7 = ::std::
               __shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Assimp::Blender::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(pEStack_40 + 7));
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_68,_x,_y,peVar7->obmat[3][2]);
      for (v._4_4_ = 0; v._4_4_ < _ys->mNumVertices; v._4_4_ = v._4_4_ + 1) {
        paStack_78 = _ys->mVertices + v._4_4_;
        paStack_78->x = local_2ac * ((float)local_68 - paStack_78->x) + (float)local_68;
        paStack_78->y = center.z * ((float)i_1 - paStack_78->y) + (float)i_1;
        paStack_78->z = center.y * (center.x - paStack_78->z) + center.x;
      }
    }
    else {
      for (v_1._4_4_ = 0; v_1._4_4_ < _ys->mNumVertices; v_1._4_4_ = v_1._4_4_ + 1) {
        paStack_88 = _ys->mVertices + v_1._4_4_;
        paStack_88->x = local_2ac * paStack_88->x;
        paStack_88->y = center.z * paStack_88->y;
        paStack_88->z = center.y * paStack_88->z;
      }
    }
    if (_ys->mNormals != (aiVector3D *)0x0) {
      for (v_2._4_4_ = 0; v_2._4_4_ < _ys->mNumVertices; v_2._4_4_ = v_2._4_4_ + 1) {
        paStack_98 = _ys->mNormals + v_2._4_4_;
        paStack_98->x = local_2ac * paStack_98->x;
        paStack_98->y = center.z * paStack_98->y;
        paStack_98->z = center.y * paStack_98->z;
      }
    }
    if (_ys->mTangents != (aiVector3D *)0x0) {
      for (v_3._4_4_ = 0; v_3._4_4_ < _ys->mNumVertices; v_3._4_4_ = v_3._4_4_ + 1) {
        paStack_a8 = _ys->mTangents + v_3._4_4_;
        paStack_a8->x = local_2ac * paStack_a8->x;
        paStack_a8->y = center.z * paStack_a8->y;
        paStack_a8->z = center.y * paStack_a8->z;
      }
    }
    if (_ys->mBitangents != (aiVector3D *)0x0) {
      for (v_4._4_4_ = 0; v_4._4_4_ < _ys->mNumVertices; v_4._4_4_ = v_4._4_4_ + 1) {
        _vs = _ys->mBitangents + v_4._4_4_;
        _vs->x = local_2ac * _vs->x;
        _vs->y = center.z * _vs->y;
        _vs->z = center.y * _vs->z;
      }
    }
    local_2cc = 0xbf800000;
    if (((ulong)pEStack_40[6].dna_type & 0x20000) == 0) {
      local_2cc = 0x3f800000;
    }
    n = local_2cc;
    local_2d4 = 0xbf800000;
    if (((ulong)pEStack_40[6].dna_type & 0x40000) == 0) {
      local_2d4 = 0x3f800000;
    }
    i_6 = local_2d4;
    v_5._4_4_ = 0;
    while (bVar3 = aiMesh::HasTextureCoords(_ys,v_5._4_4_), bVar3) {
      for (v_5._0_4_ = 0; (uint)v_5 < _ys->mNumVertices; v_5._0_4_ = (uint)v_5 + 1) {
        paStack_d0 = _ys->mTextureCoords[v_5._4_4_] + (uint)v_5;
        paStack_d0->x = (float)n * paStack_d0->x;
        paStack_d0->y = (float)i_6 * paStack_d0->y;
      }
      v_5._4_4_ = v_5._4_4_ + 1;
    }
    if (local_2ac * center.z * center.y < 0.0) {
      for (face._4_4_ = 0; face._4_4_ < _ys->mNumFaces; face._4_4_ = face._4_4_ + 1) {
        paStack_e0 = _ys->mFaces + face._4_4_;
        for (nind._4_4_ = 0; nind._4_4_ < paStack_e0->mNumIndices >> 1; nind._4_4_ = nind._4_4_ + 1)
        {
          ::std::swap<unsigned_int>
                    (paStack_e0->mIndices + nind._4_4_,
                     paStack_e0->mIndices + ((paStack_e0->mNumIndices - 1) - nind._4_4_));
        }
      }
    }
    pmVar4 = TempArray<std::vector,_aiMesh>::operator->
                       ((TempArray<std::vector,_aiMesh> *)(orig_modifier_local + 3));
    ::std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(pmVar4,(value_type *)&ys);
  }
  auVar2 = ZEXT416((uint)(*(int *)&conv_data_local[3].lights.arr.
                                   super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl
                                   .super__Vector_impl_data._M_end_of_storage << 1)) * ZEXT816(4);
  uVar8 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  local_f0 = (pointer)operator_new__(uVar8);
  ::std::copy<unsigned_int*,unsigned_int*>
            ((uint *)conv_data_local[3].materials.arr.
                     super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
             (uint *)((long)conv_data_local[3].materials.arr.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     (ulong)*(uint *)&conv_data_local[3].lights.arr.
                                      super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage * 4),
             (uint *)local_f0);
  local_f8 = conv_data_local;
  ::std::
  transform<unsigned_int*,unsigned_int*,Assimp::Blender::BlenderModifier_Mirror::DoIt(aiNode&,Assimp::Blender::ConversionData&,Assimp::Blender::ElemBase_const&,Assimp::Blender::Scene_const&,Assimp::Blender::Object_const&)::__0>
            ((uint *)conv_data_local[3].materials.arr.
                     super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
             (uint *)((long)conv_data_local[3].materials.arr.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_start +
                     (ulong)*(uint *)&conv_data_local[3].lights.arr.
                                      super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage * 4),
             (uint *)((long)local_f0 +
                     (ulong)*(uint *)&conv_data_local[3].lights.arr.
                                      super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage * 4),
             (anon_class_8_1_ba1d6aae)conv_data_local);
  ppaVar1 = conv_data_local[3].materials.arr.
            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar1 != (pointer)0x0) {
    operator_delete__(ppaVar1);
  }
  conv_data_local[3].materials.arr.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
  _M_impl.super__Vector_impl_data._M_start = local_f0;
  *(int *)&conv_data_local[3].lights.arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage =
       *(int *)&conv_data_local[3].lights.arr.
                super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage * 2;
  this_01 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[50]>
            (&local_290,(char (*) [50])"BlendModifier: Applied the `Mirror` modifier to `");
  this_02 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &local_290,(char (*) [1024])&(mir->modifier).next);
  this_03 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      (this_02,(char (*) [2])0xb5078c);
  Formatter::basic_formatter::operator_cast_to_string(&local_118,this_03);
  Logger::info(this_01,&local_118);
  ::std::__cxx11::string::~string((string *)&local_118);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_290);
  return;
}

Assistant:

void  BlenderModifier_Mirror :: DoIt(aiNode& out, ConversionData& conv_data,  const ElemBase& orig_modifier,
    const Scene& /*in*/,
    const Object& orig_object )
{
    // hijacking the ABI, see the big note in BlenderModifierShowcase::ApplyModifiers()
    const MirrorModifierData& mir = static_cast<const MirrorModifierData&>(orig_modifier);
    ai_assert(mir.modifier.type == ModifierData::eModifierType_Mirror);

    conv_data.meshes->reserve(conv_data.meshes->size() + out.mNumMeshes);

    // XXX not entirely correct, mirroring on two axes results in 4 distinct objects in blender ...

    // take all input meshes and clone them
    for (unsigned int i = 0; i < out.mNumMeshes; ++i) {
        aiMesh* mesh;
        SceneCombiner::Copy(&mesh,conv_data.meshes[out.mMeshes[i]]);

        const float xs = mir.flag & MirrorModifierData::Flags_AXIS_X ? -1.f : 1.f;
        const float ys = mir.flag & MirrorModifierData::Flags_AXIS_Y ? -1.f : 1.f;
        const float zs = mir.flag & MirrorModifierData::Flags_AXIS_Z ? -1.f : 1.f;

        if (mir.mirror_ob) {
            const aiVector3D center( mir.mirror_ob->obmat[3][0],mir.mirror_ob->obmat[3][1],mir.mirror_ob->obmat[3][2] );
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];

                v.x = center.x + xs*(center.x - v.x);
                v.y = center.y + ys*(center.y - v.y);
                v.z = center.z + zs*(center.z - v.z);
            }
        }
        else {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mVertices[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mNormals) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mNormals[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mTangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        if (mesh->mBitangents) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mBitangents[i];
                v.x *= xs;v.y *= ys;v.z *= zs;
            }
        }

        const float us = mir.flag & MirrorModifierData::Flags_MIRROR_U ? -1.f : 1.f;
        const float vs = mir.flag & MirrorModifierData::Flags_MIRROR_V ? -1.f : 1.f;

        for (unsigned int n = 0; mesh->HasTextureCoords(n); ++n) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                aiVector3D& v = mesh->mTextureCoords[n][i];
                v.x *= us;v.y *= vs;
            }
        }

        // Only reverse the winding order if an odd number of axes were mirrored.
        if (xs * ys * zs < 0) {
            for( unsigned int i = 0; i < mesh->mNumFaces; i++) {
                aiFace& face = mesh->mFaces[i];
                for( unsigned int fi = 0; fi < face.mNumIndices / 2; ++fi)
                    std::swap( face.mIndices[fi], face.mIndices[face.mNumIndices - 1 - fi]);
            }
        }

        conv_data.meshes->push_back(mesh);
    }
    unsigned int* nind = new unsigned int[out.mNumMeshes*2];

    std::copy(out.mMeshes,out.mMeshes+out.mNumMeshes,nind);
    std::transform(out.mMeshes,out.mMeshes+out.mNumMeshes,nind+out.mNumMeshes,
        [&out](unsigned int n) { return out.mNumMeshes + n; });

    delete[] out.mMeshes;
    out.mMeshes = nind;
    out.mNumMeshes *= 2;

    ASSIMP_LOG_INFO_F("BlendModifier: Applied the `Mirror` modifier to `",
        orig_object.id.name,"`");
}